

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::setImage
          (Image<float,_gimage::PixelTraits<float>_> *this,
          Image<float,_gimage::PixelTraits<float>_> *a)

{
  long lVar1;
  long lVar2;
  
  setSize(this,a->width,a->height,(long)a->depth);
  lVar1 = this->n;
  lVar2 = -lVar1;
  if (0 < lVar1) {
    lVar2 = lVar1;
  }
  memcpy(this->pixel,**a->img,lVar2 << 2);
  return;
}

Assistant:

void setImage(const Image<T> &a)
    {
      setSize(a.getWidth(), a.getHeight(), a.getDepth());
      memcpy(pixel, a.getPtr(0, 0, 0), std::abs(n)*sizeof(T));
    }